

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.h
# Opt level: O0

void __thiscall
presolve::HighsPostsolveStack::doubletonEquation<HighsEmptySlice>
          (HighsPostsolveStack *this,HighsInt row,HighsInt colSubst,HighsInt col,double coefSubst,
          double coef,double rhs,double substLower,double substUpper,double substCost,
          bool lowerTightened,bool upperTightened,RowType rowType,
          HighsMatrixSlice<HighsEmptySlice> *colVec)

{
  char *pcVar1;
  HighsDataStack *__s;
  reference pvVar2;
  int in_ECX;
  uint in_EDX;
  undefined8 extraout_RDX;
  undefined8 uVar3;
  undefined8 extraout_RDX_00;
  int in_ESI;
  long in_RDI;
  byte in_R8B;
  byte in_R9B;
  HighsInt HStack0000000000000010;
  bool bStack0000000000000014;
  bool bStack0000000000000015;
  undefined2 uStack0000000000000016;
  HighsSliceNonzero *colVal;
  HighsSliceNonzero *__end0;
  HighsSliceNonzero *__begin0;
  HighsMatrixSlice<HighsEmptySlice> *__range2;
  value_type local_104;
  double *in_stack_ffffffffffffff00;
  int *in_stack_ffffffffffffff08;
  DoubletonEquation *r;
  ReductionType type;
  HighsPostsolveStack *in_stack_ffffffffffffff10;
  vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
  *in_stack_ffffffffffffff18;
  HighsDataStack *in_stack_ffffffffffffff20;
  undefined1 local_90 [70];
  byte local_4a;
  byte local_49;
  int local_14;
  uint local_10;
  int local_c;
  
  __s = (HighsDataStack *)(ulong)in_EDX;
  local_49 = in_R8B & 1;
  local_4a = in_R9B & 1;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  std::
  vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
  ::clear((vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
           *)0x725553);
  local_90._56_4_ = HStack0000000000000010;
  local_90[0x3c] = bStack0000000000000014;
  local_90[0x3d] = bStack0000000000000015;
  local_90._62_2_ = uStack0000000000000016;
  local_90._48_8_ = HighsMatrixSlice<HighsEmptySlice>::begin();
  local_90._40_8_ = HighsMatrixSlice<HighsEmptySlice>::end();
  uVar3 = extraout_RDX;
  for (; local_90._48_8_ != local_90._40_8_; local_90._48_8_ = local_90._48_8_ + 0x10) {
    local_90._32_8_ = local_90._48_8_;
    in_stack_ffffffffffffff18 =
         (vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
          *)(in_RDI + 0xc0);
    in_stack_ffffffffffffff10 = (HighsPostsolveStack *)(in_RDI + 0x78);
    pcVar1 = HighsSliceNonzero::index((HighsSliceNonzero *)local_90._48_8_,(char *)__s,(int)uVar3);
    __s = (HighsDataStack *)
          std::vector<int,_std::allocator<int>_>::operator[]
                    ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff10,
                     (long)(int)pcVar1);
    local_90._24_8_ = HighsSliceNonzero::value((HighsSliceNonzero *)local_90._32_8_);
    in_stack_ffffffffffffff20 = __s;
    std::
    vector<presolve::HighsPostsolveStack::Nonzero,std::allocator<presolve::HighsPostsolveStack::Nonzero>>
    ::emplace_back<int&,double>
              ((vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    uVar3 = extraout_RDX_00;
  }
  r = (DoubletonEquation *)local_90;
  if (local_c == -1) {
    local_104 = -1;
  }
  else {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x78),(long)local_c);
    local_104 = *pvVar2;
  }
  *(value_type *)&r->coef = local_104;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x60),(long)(int)local_10);
  local_90._4_4_ = *pvVar2;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x60),(long)local_14);
  local_90._8_4_ = *pvVar2;
  local_90[0xc] = local_49 & 1;
  local_90[0xd] = local_4a & 1;
  HighsDataStack::push<presolve::HighsPostsolveStack::DoubletonEquation,_0>
            ((HighsDataStack *)in_stack_ffffffffffffff10,r);
  type = (ReductionType)((ulong)r >> 0x38);
  HighsDataStack::push<presolve::HighsPostsolveStack::Nonzero>
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  reductionAdded(in_stack_ffffffffffffff10,type);
  return;
}

Assistant:

void doubletonEquation(HighsInt row, HighsInt colSubst, HighsInt col,
                         double coefSubst, double coef, double rhs,
                         double substLower, double substUpper, double substCost,
                         bool lowerTightened, bool upperTightened,
                         RowType rowType,
                         const HighsMatrixSlice<ColStorageFormat>& colVec) {
    colValues.clear();
    for (const HighsSliceNonzero& colVal : colVec)
      colValues.emplace_back(origRowIndex[colVal.index()], colVal.value());

    reductionValues.push(DoubletonEquation{
        coef, coefSubst, rhs, substLower, substUpper, substCost,
        row == -1 ? -1 : origRowIndex[row], origColIndex[colSubst],
        origColIndex[col], lowerTightened, upperTightened, rowType});
    reductionValues.push(colValues);
    reductionAdded(ReductionType::kDoubletonEquation);
  }